

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsDrawTest.cpp
# Opt level: O2

void __thiscall deqp::gls::AttributePack::updateProgram(AttributePack *this)

{
  pointer *this_00;
  bool bVar1;
  OutputType OVar2;
  RenderContext *pRVar3;
  pointer ppAVar4;
  AttributeArray *pAVar5;
  ShaderProgram *pSVar6;
  ContextType CVar7;
  undefined4 uVar8;
  deUint32 dVar9;
  ostream *poVar10;
  ulong *puVar11;
  ulong uVar12;
  int arrayNdx;
  long lVar13;
  GenericVecType GVar14;
  char *pcVar15;
  GeometryShaderInputType *this_01;
  int arrayNdx_1;
  int iVar16;
  size_type __n;
  reference rVar17;
  allocator<char> local_3a9;
  ShaderProgram *local_3a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  params;
  string local_348;
  string local_328;
  VertexSource local_308;
  string local_2e8;
  stringstream vertexShaderTmpl;
  undefined4 local_2c0 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b8;
  undefined4 *local_2a8;
  undefined8 local_2a0;
  ShaderProgramDeclaration local_140;
  
  if (this->m_programID != 0) {
    (*this->m_ctx->_vptr_Context[0x77])();
  }
  if (this->m_program != (ShaderProgram *)0x0) {
    (*(this->m_program->super_VertexShader)._vptr_VertexShader[2])();
  }
  local_3a8 = (ShaderProgram *)operator_new(0x1b0);
  pRVar3 = this->m_renderCtx;
  sglr::pdec::ShaderProgramDeclaration::ShaderProgramDeclaration(&local_140);
  for (local_348._M_dataplus._M_p._0_4_ = 0;
      (int)local_348._M_dataplus._M_p <
      (int)((ulong)((long)(this->m_arrays).
                          super__Vector_base<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->m_arrays).
                         super__Vector_base<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 3);
      local_348._M_dataplus._M_p._0_4_ = (int)local_348._M_dataplus._M_p + 1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3a0,"a_",(allocator<char> *)&local_308);
    de::toString<int>(&local_328,(int *)&local_348);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&params,
                   &local_3a0,&local_328);
    uVar12 = (ulong)(this->m_arrays).
                    super__Vector_base<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
                    ._M_impl.super__Vector_impl_data._M_start[(int)local_348._M_dataplus._M_p]->
                    m_outputType;
    GVar14 = GENERICVECTYPE_LAST;
    if (uVar12 < 0xc) {
      GVar14 = *(GenericVecType *)(&DAT_00a2a848 + uVar12 * 4);
    }
    std::__cxx11::string::string((string *)&vertexShaderTmpl,(string *)&params);
    local_2a8 = (undefined4 *)CONCAT44(local_2a8._4_4_,GVar14);
    sglr::pdec::ShaderProgramDeclaration::operator<<
              (&local_140,(VertexAttribute *)&vertexShaderTmpl);
    std::__cxx11::string::~string((string *)&vertexShaderTmpl);
    std::__cxx11::string::~string((string *)&params);
    std::__cxx11::string::~string((string *)&local_328);
    std::__cxx11::string::~string((string *)&local_3a0);
  }
  _vertexShaderTmpl = GENERICVECTYPE_FLOAT;
  sglr::pdec::ShaderProgramDeclaration::operator<<
            (&local_140,(VertexToFragmentVarying *)&vertexShaderTmpl);
  _vertexShaderTmpl = GENERICVECTYPE_FLOAT;
  sglr::pdec::ShaderProgramDeclaration::operator<<(&local_140,(FragmentOutput *)&vertexShaderTmpl);
  params._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &params._M_t._M_impl.super__Rb_tree_header._M_header;
  params._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  params._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  params._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       params._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::stringstream::stringstream((stringstream *)&vertexShaderTmpl);
  CVar7.super_ApiType.m_bits = (ApiType)(*pRVar3->_vptr_RenderContext[2])();
  anon_unknown_1::DrawTestShaderProgram::generateShaderParams(&params,CVar7);
  std::operator<<((ostream *)local_2b8._M_local_buf,"${VTX_HDR}");
  for (lVar13 = 0;
      lVar13 < (int)((ulong)((long)(this->m_arrays).
                                   super__Vector_base<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->m_arrays).
                                  super__Vector_base<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 3);
      lVar13 = lVar13 + 1) {
    poVar10 = std::operator<<((ostream *)local_2b8._M_local_buf,"${VTX_IN} highp ");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3a0,
               DrawTestSpec::outputTypeToString::types
               [(int)(this->m_arrays).
                     super__Vector_base<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar13]->m_outputType],
               (allocator<char> *)&local_328);
    poVar10 = std::operator<<(poVar10,(string *)&local_3a0);
    poVar10 = std::operator<<(poVar10," a_");
    poVar10 = (ostream *)std::ostream::operator<<(poVar10,(int)lVar13);
    std::operator<<(poVar10,";\n");
    std::__cxx11::string::~string((string *)&local_3a0);
  }
  std::operator<<((ostream *)local_2b8._M_local_buf,
                  "uniform highp float u_coordScale;\nuniform highp float u_colorScale;\n${VTX_OUT} ${COL_PRECISION} vec4 v_color;\nvoid main(void)\n{\n\tgl_PointSize = 1.0;\n\thighp vec2 coord = vec2(0.0, 0.0);\n\thighp vec3 color = vec3(1.0, 1.0, 1.0);\n"
                 );
  lVar13 = 0;
  do {
    ppAVar4 = (this->m_arrays).
              super__Vector_base<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    iVar16 = (int)lVar13;
    if ((int)((ulong)((long)(this->m_arrays).
                            super__Vector_base<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppAVar4) >> 3) <=
        lVar13) {
      std::operator<<((ostream *)local_2b8._M_local_buf,
                      "\tv_color = vec4(u_colorScale * color, 1.0) * 0.5 + vec4(0.5, 0.5, 0.5, 0.5);\n\tgl_Position = vec4(u_coordScale * coord, 1.0, 1.0);\n}\n"
                     );
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_328,
                 (char *)CONCAT44(local_348._M_dataplus._M_p._4_4_,(int)local_348._M_dataplus._M_p),
                 &local_3a9);
      tcu::StringTemplate::StringTemplate((StringTemplate *)&local_3a0,&local_328);
      tcu::StringTemplate::specialize(&local_2e8,(StringTemplate *)&local_3a0,&params);
      tcu::StringTemplate::~StringTemplate((StringTemplate *)&local_3a0);
      std::__cxx11::string::~string((string *)&local_328);
      std::__cxx11::string::~string((string *)&local_348);
      std::__cxx11::stringstream::~stringstream((stringstream *)&vertexShaderTmpl);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&params._M_t);
      std::__cxx11::string::string((string *)&local_308,(string *)&local_2e8);
      sglr::pdec::ShaderProgramDeclaration::operator<<(&local_140,&local_308);
      std::__cxx11::string::~string((string *)&local_308);
      std::__cxx11::string::~string((string *)&local_2e8);
      local_2b8._8_8_ = local_2c0;
      local_2c0[0] = 0;
      local_2b8._M_allocated_capacity = 0;
      local_2a0 = 0;
      local_2a8 = (undefined4 *)local_2b8._8_8_;
      CVar7.super_ApiType.m_bits = (ApiType)(*pRVar3->_vptr_RenderContext[2])();
      anon_unknown_1::DrawTestShaderProgram::generateShaderParams
                ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&vertexShaderTmpl,CVar7);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3a0,
                 "${FRAG_HDR}${FRAG_IN} ${COL_PRECISION} vec4 v_color;\nvoid main(void)\n{\n\t${FRAG_COLOR} = v_color;\n}\n"
                 ,(allocator<char> *)&local_308);
      tcu::StringTemplate::StringTemplate((StringTemplate *)&params,&local_3a0);
      tcu::StringTemplate::specialize
                (&local_348,(StringTemplate *)&params,
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&vertexShaderTmpl);
      tcu::StringTemplate::~StringTemplate((StringTemplate *)&params);
      std::__cxx11::string::~string((string *)&local_3a0);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&vertexShaderTmpl);
      std::__cxx11::string::string((string *)&local_328,(string *)&local_348);
      sglr::pdec::ShaderProgramDeclaration::operator<<(&local_140,(FragmentSource *)&local_328);
      std::__cxx11::string::~string((string *)&local_328);
      std::__cxx11::string::~string((string *)&local_348);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&params,"u_coordScale",(allocator<char> *)&local_3a0);
      std::__cxx11::string::string((string *)&vertexShaderTmpl,(string *)&params);
      local_2a8._0_4_ = GENERICVECTYPE_UINT32;
      sglr::pdec::ShaderProgramDeclaration::operator<<(&local_140,(Uniform *)&vertexShaderTmpl);
      std::__cxx11::string::~string((string *)&vertexShaderTmpl);
      std::__cxx11::string::~string((string *)&params);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&params,"u_colorScale",(allocator<char> *)&local_3a0);
      std::__cxx11::string::string((string *)&vertexShaderTmpl,(string *)&params);
      local_2a8 = (undefined4 *)CONCAT44(local_2a8._4_4_,GENERICVECTYPE_UINT32);
      sglr::pdec::ShaderProgramDeclaration::operator<<(&local_140,(Uniform *)&vertexShaderTmpl);
      std::__cxx11::string::~string((string *)&vertexShaderTmpl);
      std::__cxx11::string::~string((string *)&params);
      pSVar6 = local_3a8;
      sglr::ShaderProgram::ShaderProgram(local_3a8,&local_140);
      sglr::pdec::ShaderProgramDeclaration::~ShaderProgramDeclaration(&local_140);
      (pSVar6->super_VertexShader)._vptr_VertexShader = (_func_int **)&PTR_shadeVertices_00c423c0;
      (pSVar6->super_GeometryShader)._vptr_GeometryShader = (_func_int **)&DAT_00c423f8;
      (pSVar6->super_FragmentShader)._vptr_FragmentShader = (_func_int **)&DAT_00c42410;
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)(pSVar6 + 1),
                 (long)(this->m_arrays).
                       super__Vector_base<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->m_arrays).
                       super__Vector_base<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3,
                 (allocator_type *)&vertexShaderTmpl);
      this_00 = &pSVar6[1].super_VertexShader.m_inputs.
                 super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
      std::vector<bool,_std::allocator<bool>_>::vector
                ((vector<bool,_std::allocator<bool>_> *)this_00,
                 (long)(this->m_arrays).
                       super__Vector_base<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->m_arrays).
                       super__Vector_base<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3,
                 (allocator_type *)&vertexShaderTmpl);
      this_01 = &pSVar6[1].super_GeometryShader.m_inputType;
      std::vector<rr::GenericVecType,_std::allocator<rr::GenericVecType>_>::vector
                ((vector<rr::GenericVecType,_std::allocator<rr::GenericVecType>_> *)this_01,
                 (long)(this->m_arrays).
                       super__Vector_base<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->m_arrays).
                       super__Vector_base<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3,
                 (allocator_type *)&vertexShaderTmpl);
      for (__n = 0; ppAVar4 = (this->m_arrays).
                              super__Vector_base<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
                              ._M_impl.super__Vector_impl_data._M_start,
          (long)__n <
          (long)(int)((ulong)((long)(this->m_arrays).
                                    super__Vector_base<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppAVar4) >> 3
                     ); __n = __n + 1) {
        pAVar5 = ppAVar4[__n];
        uVar12 = (ulong)pAVar5->m_outputType;
        iVar16 = 0;
        if (uVar12 < 0xc) {
          iVar16 = *(int *)(&DAT_00a2a818 + uVar12 * 4);
        }
        (((_Vector_impl *)&pSVar6[1].super_VertexShader._vptr_VertexShader)->super__Vector_impl_data
        )._M_start[__n] = iVar16;
        bVar1 = pAVar5->m_isPositionAttr;
        rVar17 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           ((vector<bool,_std::allocator<bool>_> *)this_00,__n);
        puVar11 = rVar17._M_p;
        if (bVar1 == false) {
          uVar12 = ~rVar17._M_mask & *puVar11;
        }
        else {
          uVar12 = rVar17._M_mask | *puVar11;
        }
        *puVar11 = uVar12;
        uVar12 = (ulong)(this->m_arrays).
                        super__Vector_base<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
                        ._M_impl.super__Vector_impl_data._M_start[__n]->m_outputType;
        uVar8 = 3;
        if (uVar12 < 0xc) {
          uVar8 = *(undefined4 *)(&DAT_00a2a848 + uVar12 * 4);
        }
        *(undefined4 *)(*(long *)this_01 + __n * 4) = uVar8;
      }
      this->m_program = local_3a8;
      dVar9 = (*this->m_ctx->_vptr_Context[0x75])();
      this->m_programID = dVar9;
      return;
    }
    pAVar5 = ppAVar4[lVar13];
    OVar2 = pAVar5->m_outputType;
    if (pAVar5->m_isPositionAttr != true) {
      pcVar15 = "\tcolor.rg = color.rg * vec2(a_";
      switch(OVar2) {
      case OUTPUTTYPE_FLOAT:
      case OUTPUTTYPE_INT:
      case OUTPUTTYPE_UINT:
        poVar10 = std::operator<<((ostream *)local_2b8._M_local_buf,"\tcolor = color * float(a_");
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,iVar16);
        pcVar15 = ");\n";
        break;
      case OUTPUTTYPE_VEC2:
      case OUTPUTTYPE_IVEC2:
      case OUTPUTTYPE_UVEC2:
        goto switchD_00857e2b_caseD_1;
      case OUTPUTTYPE_VEC3:
      case OUTPUTTYPE_IVEC3:
      case OUTPUTTYPE_UVEC3:
        poVar10 = std::operator<<((ostream *)local_2b8._M_local_buf,"\tcolor = color.rgb * vec3(a_")
        ;
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,iVar16);
        pcVar15 = ".xyz);\n";
        break;
      case OUTPUTTYPE_VEC4:
      case OUTPUTTYPE_IVEC4:
      case OUTPUTTYPE_UVEC4:
        poVar10 = std::operator<<((ostream *)local_2b8._M_local_buf,"\tcolor = color.rgb * vec3(a_")
        ;
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,iVar16);
        poVar10 = std::operator<<(poVar10,".xyz) * float(a_");
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,iVar16);
        pcVar15 = ".w);\n";
        break;
      default:
        goto switchD_00857e2b_default;
      }
      goto LAB_00857fbd;
    }
    pcVar15 = "\tcoord += vec2(a_";
    switch(OVar2) {
    case OUTPUTTYPE_FLOAT:
    case OUTPUTTYPE_INT:
    case OUTPUTTYPE_UINT:
      poVar10 = std::operator<<((ostream *)local_2b8._M_local_buf,"\tcoord += vec2(float(a_");
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,iVar16);
      poVar10 = std::operator<<(poVar10,"), float(a_");
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,iVar16);
      pcVar15 = "));\n";
      break;
    case OUTPUTTYPE_VEC2:
    case OUTPUTTYPE_IVEC2:
    case OUTPUTTYPE_UVEC2:
switchD_00857e2b_caseD_1:
      poVar10 = std::operator<<((ostream *)local_2b8._M_local_buf,pcVar15);
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,iVar16);
      pcVar15 = ".xy);\n";
      break;
    case OUTPUTTYPE_VEC3:
    case OUTPUTTYPE_IVEC3:
    case OUTPUTTYPE_UVEC3:
      poVar10 = std::operator<<((ostream *)local_2b8._M_local_buf,"\tcoord += vec2(a_");
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,iVar16);
      poVar10 = std::operator<<(poVar10,".xy);\n\tcoord.x += float(a_");
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,iVar16);
      pcVar15 = ".z);\n";
      break;
    case OUTPUTTYPE_VEC4:
    case OUTPUTTYPE_IVEC4:
    case OUTPUTTYPE_UVEC4:
      poVar10 = std::operator<<((ostream *)local_2b8._M_local_buf,"\tcoord += vec2(a_");
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,iVar16);
      poVar10 = std::operator<<(poVar10,".xy);\n\tcoord += vec2(a_");
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,iVar16);
      pcVar15 = ".zw);\n";
      break;
    default:
      goto switchD_00857e2b_default;
    }
LAB_00857fbd:
    std::operator<<(poVar10,pcVar15);
switchD_00857e2b_default:
    lVar13 = lVar13 + 1;
  } while( true );
}

Assistant:

void AttributePack::updateProgram (void)
{
	if (m_programID)
		m_ctx.deleteProgram(m_programID);
	if (m_program)
		delete m_program;

	m_program = new DrawTestShaderProgram(m_renderCtx, m_arrays);
	m_programID = m_ctx.createProgram(m_program);
}